

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O0

void diy::Serialization<diy::DynamicPoint<float,_4UL>_>::save(BinaryBuffer *bb,Point *p)

{
  size_t sVar1;
  BinaryBuffer *bb_00;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_RSI;
  float *in_RDI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_stack_ffffffffffffffe0;
  
  sVar1 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::size(in_RSI);
  save<unsigned_long>((BinaryBuffer *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (sVar1 != 0) {
    bb_00 = (BinaryBuffer *)
            itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                      (in_stack_ffffffffffffffe0,(size_type)in_RDI);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::size(in_RSI);
    save<float>(bb_00,in_RDI,0x1239fb);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Point& p)
    {
      size_t s = p.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &p[0], p.size());
    }